

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_3>,_tcu::Matrix<double,_3,_4>_>::call
          (unary<tcu::Matrix<double,_4,_3>,_tcu::Matrix<double,_3,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  int row_2;
  undefined8 *puVar9;
  GLdouble *data;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 *puVar13;
  uint uVar14;
  Matrix<double,_3,_4> arg;
  Matrix<double,_4,_3> result;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128 [23];
  undefined1 local_70 [96];
  
  puVar9 = &local_138;
  puVar8 = local_128 + 10;
  local_128[0x14] = 0;
  local_128[0x15] = 0;
  local_128[0x12] = 0;
  local_128[0x13] = 0;
  local_128[0x10] = 0;
  local_128[0x11] = 0;
  local_128[0xe] = 0;
  local_128[0xf] = 0;
  local_128[0xc] = 0;
  local_128[0xd] = 0;
  local_128[10] = 0;
  local_128[0xb] = 0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      uVar14 = 0x3ff00000;
      if (lVar10 != lVar12) {
        uVar14 = 0;
      }
      *(ulong *)((long)puVar8 + lVar12) = (ulong)uVar14 << 0x20;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x60);
    lVar11 = lVar11 + 1;
    puVar8 = puVar8 + 1;
    lVar10 = lVar10 + 0x20;
  } while (lVar11 != 4);
  local_128[8] = 0;
  local_128[9] = 0;
  local_128[6] = 0;
  local_128[7] = 0;
  local_128[4] = 0;
  local_128[5] = 0;
  local_128[2] = 0;
  local_128[3] = 0;
  local_128[0] = 0;
  local_128[1] = 0;
  local_138 = 0;
  uStack_130 = 0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      uVar14 = 0x3ff00000;
      if (lVar10 != lVar12) {
        uVar14 = 0;
      }
      *(ulong *)((long)puVar9 + lVar12) = (ulong)uVar14 << 0x20;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x60);
    lVar11 = lVar11 + 1;
    puVar9 = (undefined8 *)((long)puVar9 + 8);
    lVar10 = lVar10 + 0x18;
  } while (lVar11 != 3);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_128 + lVar10) = *(undefined8 *)((long)argument_src + lVar10 + 0x10);
    puVar1 = (undefined4 *)((long)argument_src + lVar10);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    *(undefined4 *)((long)&local_138 + lVar10) = *puVar1;
    *(undefined4 *)((long)&local_138 + lVar10 + 4) = uVar2;
    *(undefined4 *)((long)&uStack_130 + lVar10) = uVar3;
    *(undefined4 *)((long)&uStack_130 + lVar10 + 4) = uVar4;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x60);
  puVar13 = local_70;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar13,&local_138);
  puVar8 = local_128 + 10;
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar11) = *(undefined8 *)(puVar13 + lVar11);
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x60);
    lVar10 = lVar10 + 1;
    puVar8 = puVar8 + 1;
    puVar13 = puVar13 + 8;
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    uVar5 = *(undefined8 *)((long)local_128 + lVar10 + 0x50);
    uVar6 = *(undefined8 *)((long)local_128 + lVar10 + 0x58);
    uVar7 = *(undefined8 *)((long)local_128 + lVar10 + 0x68);
    puVar8 = (undefined8 *)((long)result_dst + lVar10 + 0x10);
    *puVar8 = *(undefined8 *)((long)local_128 + lVar10 + 0x60);
    puVar8[1] = uVar7;
    *(undefined8 *)((long)result_dst + lVar10) = uVar5;
    ((undefined8 *)((long)result_dst + lVar10))[1] = uVar6;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x60);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}